

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

void __thiscall cs::domain_manager::clear_domain(domain_manager *this)

{
  stack_pointer psVar1;
  error *peVar2;
  domain_type *pdVar3;
  string local_30;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 == (stack_pointer)0x0) {
    pdVar3 = (this->m_data).m_current;
    if (pdVar3 == (this->m_data).m_start) {
      peVar2 = (error *)__cxa_allocate_exception(0x28);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
      local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
      local_30._M_string_length = 5;
      cov::error::error(peVar2,&local_30);
      __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
    }
  }
  else {
    pdVar3 = psVar1->m_current;
    if (pdVar3 == psVar1->m_start) {
      peVar2 = (error *)__cxa_allocate_exception(0x28);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
      local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
      local_30._M_string_length = 5;
      cov::error::error(peVar2,&local_30);
      __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
    }
  }
  domain_type::clear(pdVar3 + -1);
  return;
}

Assistant:

void clear_domain()
		{
			if (fiber_stack != nullptr)
				fiber_stack->top().clear();
			else
				m_data.top().clear();
		}